

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

bool pugi::impl::(anonymous_namespace)::set_value_integer<unsigned_long_long,char*,unsigned_long>
               (char **dest,unsigned_long *header,uintptr_t header_mask,unsigned_long_long value,
               bool negative)

{
  bool bVar1;
  uintptr_t uVar2;
  long lVar3;
  byte *pbVar4;
  char_t buf [64];
  byte abStack_48 [62];
  byte local_a [2];
  
  pbVar4 = local_a + 1;
  uVar2 = -header_mask;
  if ((int)value == 0) {
    uVar2 = header_mask;
  }
  lVar3 = (ulong)((int)value + 1U & 1) - 1;
  do {
    lVar3 = lVar3 + -1;
    *pbVar4 = (char)uVar2 + (char)(uVar2 / 10) * -10 | 0x30;
    pbVar4 = pbVar4 + -1;
    bVar1 = 9 < uVar2;
    uVar2 = uVar2 / 10;
  } while (bVar1);
  if (abStack_48 <= pbVar4) {
    *pbVar4 = 0x2d;
    bVar1 = strcpy_insitu<char*,unsigned_long>
                      (dest,header,0x10,pbVar4 + (byte)((byte)value ^ 1),-lVar3);
    return bVar1;
  }
  __assert_fail("result >= begin",
                "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                ,0x1218,
                "char_t *pugi::impl::(anonymous namespace)::integer_to_string(char_t *, char_t *, U, bool) [U = unsigned long long]"
               );
}

Assistant:

PUGI__FN bool set_value_integer(String& dest, Header& header, uintptr_t header_mask, U value, bool negative)
	{
		char_t buf[64];
		char_t* end = buf + sizeof(buf) / sizeof(buf[0]);
		char_t* begin = integer_to_string(buf, end, value, negative);

		return strcpy_insitu(dest, header, header_mask, begin, end - begin);
	}